

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int>::TestBody
          (SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int> *this)

{
  uint uVar1;
  __uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>,_true,_true>
  this_00;
  reference pvVar2;
  pointer *__ptr;
  ulong uVar3;
  char *pcVar4;
  Message local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  arrp;
  
  (anonymous_namespace)::ctor_counter::ctors = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2;
  uVar1 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,unsigned_int>::
          bitmap<unsigned_long_const*,void>((unsigned_long *)&gtest_ar,(unsigned_long *)&arrp);
  uVar3 = 8;
  if (uVar1 != 0) {
    uVar3 = (ulong)(POPCOUNT(uVar1) * 4 + 4);
  }
  this_00.
  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  .
  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
        )operator_new(uVar3);
  uVar1 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,unsigned_int>::
          bitmap<unsigned_long_const*,void>((unsigned_long *)&gtest_ar,(unsigned_long *)&arrp);
  *(uint *)this_00.
           super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
           .
           super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
           ._M_head_impl = uVar1;
  ((ctor_counter *)
  ((long)this_00.
         super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         .
         super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
         ._M_head_impl + 4))->v = (anonymous_namespace)::ctor_counter::ctors;
  ((sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int> *)
  ((long)this_00.
         super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         .
         super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
         ._M_head_impl + 8))->bitmap_ = (anonymous_namespace)::ctor_counter::ctors + 1;
  ((ctor_counter *)
  ((long)this_00.
         super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
         .
         super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
         ._M_head_impl + 0xc))->v = (anonymous_namespace)::ctor_counter::ctors + 2;
  (anonymous_namespace)::ctor_counter::ctors = (anonymous_namespace)::ctor_counter::ctors + 3;
  arrp._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  .
  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>,_true,_true>
        )(__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
           .
           super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
           ._M_head_impl;
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
                      ._M_head_impl,0);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[0].v","0U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
                      ._M_head_impl,2);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[2].v","1U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
                      ._M_head_impl,4);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[4].v","2U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  ::~unique_ptr(&arrp);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IndexInitializationListCtorCheck) {
    ctor_counter::ctors = 0;

    auto arrp = sparse_array<ctor_counter, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;
    EXPECT_EQ (arr[0].v, 0U);
    EXPECT_EQ (arr[2].v, 1U);
    EXPECT_EQ (arr[4].v, 2U);
}